

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_IgnoreDeprecatedFeature_Test::
~FeaturesTest_IgnoreDeprecatedFeature_Test(FeaturesTest_IgnoreDeprecatedFeature_Test *this)

{
  FeaturesTest_IgnoreDeprecatedFeature_Test *this_local;
  
  ~FeaturesTest_IgnoreDeprecatedFeature_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, IgnoreDeprecatedFeature) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  BuildFileWithWarnings(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        dependency: "google/protobuf/unittest_features.proto"
        options {
          uninterpreted_option {
            name { name_part: "features" is_extension: false }
            name { name_part: "pb.test" is_extension: true }
            name { name_part: "removed_feature" is_extension: false }
            identifier_value: "VALUE9"
          }
        }
      )pb",
      "");
}